

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

parser * parse_cmdline(parser *__return_storage_ptr__,int argc,char **argv)

{
  string local_68;
  string local_48;
  allocator local_22;
  allocator local_21;
  
  cmdline::parser::parser(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_68,"interaction",&local_22);
  std::__cxx11::string::string((string *)&local_48,"in interaction mode (default)",&local_21);
  cmdline::parser::add(__return_storage_ptr__,&local_68,'i',&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"version",&local_22);
  std::__cxx11::string::string((string *)&local_48,"show the info of version",&local_21);
  cmdline::parser::add(__return_storage_ptr__,&local_68,'v',&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  cmdline::parser::parse_check(__return_storage_ptr__,argc,argv);
  return __return_storage_ptr__;
}

Assistant:

cmdline::parser parse_cmdline(int argc, char **argv) {
    cmdline::parser argparser;

    // argparser: use '-i' or '--interaction' to get into interaction mode
    argparser.add("interaction", 'i', "in interaction mode (default)");
    // argparser: use '-v' or '--version' to show the version info
    argparser.add("version",     'v', "show the info of version");
    // argparser: use '-h' or '--help' to show the version info
    // [...](define by deafault)

    argparser.parse_check(argc, argv);
    return argparser;
}